

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O1

void sx_coro_update(sx_coro_context *ctx,float dt)

{
  sx__coro_state *psVar1;
  code *pcVar2;
  sx__coro_state *psVar3;
  int iVar4;
  sx_fiber_t pvVar5;
  float fVar6;
  
  if (ctx->cur_coro != (sx__coro_state *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xf5,"ctx->cur_coro == NULL");
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
  psVar1 = ctx->run_list;
joined_r0x0010d4dd:
  do {
    psVar3 = psVar1;
    if (psVar3 == (sx__coro_state *)0x0) {
      return;
    }
    psVar1 = psVar3->next;
    if (psVar3->ret_state == CORO_RET_WAIT) goto LAB_0010d515;
    if (psVar3->ret_state != CORO_RET_YIELD) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                        0x10e,"Invalid ret type in update loop");
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    iVar4 = (psVar3->counter).n + 1;
    (psVar3->counter).n = iVar4;
  } while (iVar4 < (psVar3->arg).n);
  goto LAB_0010d52e;
LAB_0010d515:
  fVar6 = (psVar3->counter).tm + dt;
  (psVar3->counter).tm = fVar6;
  if ((psVar3->arg).tm <= fVar6) {
LAB_0010d52e:
    ctx->cur_coro = psVar3;
    pvVar5 = (sx_fiber_t)jump_fcontext(psVar3->fiber,psVar3->user);
    psVar3->fiber = pvVar5;
  }
  goto joined_r0x0010d4dd;
}

Assistant:

void sx_coro_update(sx_coro_context* ctx, float dt)
{
    sx_assert(ctx->cur_coro == NULL);

    sx__coro_state* fs = ctx->run_list;
    while (fs) {
        sx__coro_state* next = fs->next;

        // Check state and take action for pending fibers
        switch (fs->ret_state) {
        case CORO_RET_YIELD: {
            ++fs->counter.n;
            if (fs->counter.n >= fs->arg.n) {
                ctx->cur_coro = fs;
                fs->fiber = sx_fiber_switch(fs->fiber, fs->user).from;
            }
            break;
        }
        case CORO_RET_WAIT: {
            fs->counter.tm += dt;
            if (fs->counter.tm >= fs->arg.tm) {
                ctx->cur_coro = fs;
                fs->fiber = sx_fiber_switch(fs->fiber, fs->user).from;
            }
            break;
        }
        default:
            sx_assertf(0, "Invalid ret type in update loop");
            break;
        }

        fs = next;
    }
}